

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_fwd_txfm_sse4.c
# Opt level: O2

void av1_fwd_txfm2d_4x4_sse4_1
               (int16_t *input,int32_t *coeff,int input_stride,TX_TYPE tx_type,int bd)

{
  char cVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  int8_t (*paiVar8) [5];
  undefined7 in_register_00000009;
  int bit;
  int extraout_EDX;
  int bit_00;
  int extraout_EDX_00;
  int bit_01;
  int bit_02;
  int extraout_EDX_01;
  int iVar9;
  int fliplr;
  __m128i in [4];
  
  if (0xf < (uint)CONCAT71(in_register_00000009,tx_type)) {
    return;
  }
  switch(CONCAT71(in_register_00000009,tx_type) & 0xffffffff) {
  case 0:
    load_buffer_4x4(input,in,input_stride,0,0,(int)*av1_fwd_txfm_shift_ls[0]);
    fdct4x4_sse4_1(in,in,0xd,1);
    goto LAB_0039d015;
  case 1:
    load_buffer_4x4(input,in,input_stride,0,0,(int)*av1_fwd_txfm_shift_ls[0]);
    goto LAB_0039d008;
  case 2:
    load_buffer_4x4(input,in,input_stride,0,0,(int)*av1_fwd_txfm_shift_ls[0]);
    goto LAB_0039d09e;
  case 3:
    load_buffer_4x4(input,in,input_stride,0,0,(int)*av1_fwd_txfm_shift_ls[0]);
    goto LAB_0039d1f0;
  case 4:
    load_buffer_4x4(input,in,input_stride,1,0,(int)*av1_fwd_txfm_shift_ls[0]);
LAB_0039d008:
    fadst4x4_sse4_1(in,in,0xd,1);
LAB_0039d015:
    uVar7 = in[2][1]._4_4_;
    uVar6 = in[1][1]._4_4_;
    uVar5 = (undefined4)in[1][1];
    uVar4 = in[0][1]._4_4_;
    uVar3 = (undefined4)in[0][1];
    uVar2 = in[0][0]._4_4_;
    in[0][0]._4_4_ = (undefined4)in[1][0];
    in[0][1]._0_4_ = (undefined4)in[2][0];
    in[0][1]._4_4_ = (undefined4)in[3][0];
    in[1][0]._0_4_ = uVar2;
    in[1][1]._0_4_ = in[2][0]._4_4_;
    in[1][1]._4_4_ = in[3][0]._4_4_;
    in[2][0]._0_4_ = uVar3;
    in[2][0]._4_4_ = uVar5;
    in[2][1]._4_4_ = (undefined4)in[3][1];
    in[3][0]._0_4_ = uVar4;
    in[3][0]._4_4_ = uVar6;
    in[3][1]._0_4_ = uVar7;
    paiVar8 = av1_fwd_cos_bit_row;
LAB_0039d068:
    fdct4x4_sse4_1(in,in,(int)(*paiVar8)[0],1);
    goto LAB_0039d260;
  case 5:
    load_buffer_4x4(input,in,input_stride,0,1,(int)*av1_fwd_txfm_shift_ls[0]);
LAB_0039d09e:
    fdct4x4_sse4_1(in,in,0xd,1);
LAB_0039d1fd:
    uVar7 = in[2][1]._4_4_;
    uVar6 = in[1][1]._4_4_;
    uVar5 = (undefined4)in[1][1];
    uVar4 = in[0][1]._4_4_;
    uVar3 = (undefined4)in[0][1];
    uVar2 = in[0][0]._4_4_;
    in[0][0]._4_4_ = (undefined4)in[1][0];
    in[0][1]._0_4_ = (undefined4)in[2][0];
    in[0][1]._4_4_ = (undefined4)in[3][0];
    in[1][0]._0_4_ = uVar2;
    in[1][1]._0_4_ = in[2][0]._4_4_;
    in[1][1]._4_4_ = in[3][0]._4_4_;
    in[2][0]._0_4_ = uVar3;
    in[2][0]._4_4_ = uVar5;
    in[2][1]._4_4_ = (undefined4)in[3][1];
    in[3][0]._0_4_ = uVar4;
    in[3][0]._4_4_ = uVar6;
    in[3][1]._0_4_ = uVar7;
    paiVar8 = av1_fwd_cos_bit_row;
LAB_0039d250:
    cVar1 = (*paiVar8)[0];
LAB_0039d259:
    fadst4x4_sse4_1(in,in,(int)cVar1,1);
    goto LAB_0039d260;
  case 6:
    cVar1 = *av1_fwd_txfm_shift_ls[0];
    iVar9 = 1;
    goto LAB_0039d13b;
  case 7:
    cVar1 = *av1_fwd_txfm_shift_ls[0];
    iVar9 = 0;
LAB_0039d13b:
    fliplr = 1;
LAB_0039d1e1:
    load_buffer_4x4(input,in,input_stride,iVar9,fliplr,(int)cVar1);
LAB_0039d1f0:
    fadst4x4_sse4_1(in,in,0xd,1);
    goto LAB_0039d1fd;
  case 8:
    cVar1 = *av1_fwd_txfm_shift_ls[0];
    iVar9 = 1;
    fliplr = 0;
    goto LAB_0039d1e1;
  case 9:
    load_buffer_4x4(input,in,input_stride,0,0,(int)*av1_fwd_txfm_shift_ls[0]);
    idtx4x4_sse4_1(in,in,bit_00,1);
    iVar9 = extraout_EDX_00;
    break;
  case 10:
    load_buffer_4x4(input,in,input_stride,0,0,(int)*av1_fwd_txfm_shift_ls[0]);
    fdct4x4_sse4_1(in,in,0xd,1);
    iVar9 = extraout_EDX_01;
    break;
  case 0xb:
    load_buffer_4x4(input,in,input_stride,0,0,(int)*av1_fwd_txfm_shift_ls[0]);
    idtx4x4_sse4_1(in,in,bit,1);
    uVar7 = in[2][1]._4_4_;
    uVar6 = in[1][1]._4_4_;
    uVar5 = (undefined4)in[1][1];
    uVar4 = in[0][1]._4_4_;
    uVar3 = (undefined4)in[0][1];
    uVar2 = in[0][0]._4_4_;
    in[0][0]._4_4_ = (undefined4)in[1][0];
    in[0][1]._0_4_ = (undefined4)in[2][0];
    in[0][1]._4_4_ = (undefined4)in[3][0];
    in[1][0]._0_4_ = uVar2;
    in[1][1]._0_4_ = in[2][0]._4_4_;
    in[1][1]._4_4_ = in[3][0]._4_4_;
    in[2][0]._0_4_ = uVar3;
    in[2][0]._4_4_ = uVar5;
    in[2][1]._4_4_ = (undefined4)in[3][1];
    in[3][0]._0_4_ = uVar4;
    in[3][0]._4_4_ = uVar6;
    in[3][1]._0_4_ = uVar7;
    paiVar8 = av1_fwd_cos_bit_col;
    goto LAB_0039d068;
  case 0xc:
    load_buffer_4x4(input,in,input_stride,0,0,(int)*av1_fwd_txfm_shift_ls[0]);
    goto LAB_0039cec3;
  case 0xd:
    load_buffer_4x4(input,in,input_stride,0,0,(int)*av1_fwd_txfm_shift_ls[0]);
    idtx4x4_sse4_1(in,in,bit_02,1);
    uVar7 = in[2][1]._4_4_;
    uVar6 = in[1][1]._4_4_;
    uVar5 = (undefined4)in[1][1];
    uVar4 = in[0][1]._4_4_;
    uVar3 = (undefined4)in[0][1];
    uVar2 = in[0][0]._4_4_;
    in[0][0]._4_4_ = (undefined4)in[1][0];
    in[0][1]._0_4_ = (undefined4)in[2][0];
    in[0][1]._4_4_ = (undefined4)in[3][0];
    in[1][0]._0_4_ = uVar2;
    in[1][1]._0_4_ = in[2][0]._4_4_;
    in[1][1]._4_4_ = in[3][0]._4_4_;
    in[2][0]._0_4_ = uVar3;
    in[2][0]._4_4_ = uVar5;
    in[2][1]._4_4_ = (undefined4)in[3][1];
    in[3][0]._0_4_ = uVar4;
    in[3][0]._4_4_ = uVar6;
    in[3][1]._0_4_ = uVar7;
    paiVar8 = av1_fwd_cos_bit_col;
    goto LAB_0039d250;
  case 0xe:
    load_buffer_4x4(input,in,input_stride,1,0,(int)*av1_fwd_txfm_shift_ls[0]);
LAB_0039cec3:
    fadst4x4_sse4_1(in,in,0xd,1);
    iVar9 = extraout_EDX;
    break;
  case 0xf:
    load_buffer_4x4(input,in,input_stride,0,1,(int)*av1_fwd_txfm_shift_ls[0]);
    cVar1 = '\r';
    idtx4x4_sse4_1(in,in,bit_01,1);
    uVar7 = in[2][1]._4_4_;
    uVar6 = in[1][1]._4_4_;
    uVar5 = (undefined4)in[1][1];
    uVar4 = in[0][1]._4_4_;
    uVar3 = (undefined4)in[0][1];
    uVar2 = in[0][0]._4_4_;
    in[0][0]._4_4_ = (undefined4)in[1][0];
    in[0][1]._0_4_ = (undefined4)in[2][0];
    in[0][1]._4_4_ = (undefined4)in[3][0];
    in[1][0]._0_4_ = uVar2;
    in[1][1]._0_4_ = in[2][0]._4_4_;
    in[1][1]._4_4_ = in[3][0]._4_4_;
    in[2][0]._0_4_ = uVar3;
    in[2][0]._4_4_ = uVar5;
    in[2][1]._4_4_ = (undefined4)in[3][1];
    in[3][0]._0_4_ = uVar4;
    in[3][0]._4_4_ = uVar6;
    in[3][1]._0_4_ = uVar7;
    goto LAB_0039d259;
  }
  uVar7 = in[2][1]._4_4_;
  uVar6 = in[1][1]._4_4_;
  uVar5 = (undefined4)in[1][1];
  uVar4 = in[0][1]._4_4_;
  uVar3 = (undefined4)in[0][1];
  uVar2 = in[0][0]._4_4_;
  in[0][0]._4_4_ = (undefined4)in[1][0];
  in[0][1]._0_4_ = (undefined4)in[2][0];
  in[0][1]._4_4_ = (undefined4)in[3][0];
  in[1][0]._0_4_ = uVar2;
  in[1][1]._0_4_ = in[2][0]._4_4_;
  in[1][1]._4_4_ = in[3][0]._4_4_;
  in[2][0]._0_4_ = uVar3;
  in[2][0]._4_4_ = uVar5;
  in[2][1]._4_4_ = (undefined4)in[3][1];
  in[3][0]._0_4_ = uVar4;
  in[3][0]._4_4_ = uVar6;
  in[3][1]._0_4_ = uVar7;
  idtx4x4_sse4_1(in,in,iVar9,1);
LAB_0039d260:
  *(ulong *)coeff = CONCAT44(in[0][0]._4_4_,(undefined4)in[0][0]);
  *(ulong *)(coeff + 2) = CONCAT44(in[0][1]._4_4_,(undefined4)in[0][1]);
  *(ulong *)(coeff + 4) = CONCAT44(in[1][0]._4_4_,(undefined4)in[1][0]);
  *(ulong *)(coeff + 6) = CONCAT44(in[1][1]._4_4_,(undefined4)in[1][1]);
  *(ulong *)(coeff + 8) = CONCAT44(in[2][0]._4_4_,(undefined4)in[2][0]);
  *(ulong *)(coeff + 10) = CONCAT44(in[2][1]._4_4_,(undefined4)in[2][1]);
  *(ulong *)(coeff + 0xc) = CONCAT44(in[3][0]._4_4_,(undefined4)in[3][0]);
  *(ulong *)(coeff + 0xe) = CONCAT44(in[3][1]._4_4_,(undefined4)in[3][1]);
  return;
}

Assistant:

void av1_fwd_txfm2d_4x4_sse4_1(const int16_t *input, int32_t *coeff,
                               int input_stride, TX_TYPE tx_type, int bd) {
  __m128i in[4];
  const int8_t *shift = av1_fwd_txfm_shift_ls[TX_4X4];
  const int txw_idx = get_txw_idx(TX_4X4);
  const int txh_idx = get_txh_idx(TX_4X4);

  switch (tx_type) {
    case DCT_DCT:
      load_buffer_4x4(input, in, input_stride, 0, 0, shift[0]);
      fdct4x4_sse4_1(in, in, av1_fwd_cos_bit_col[txw_idx][txh_idx], 1);
      transpose_32bit_4x4(in, in);
      fdct4x4_sse4_1(in, in, av1_fwd_cos_bit_row[txw_idx][txh_idx], 1);
      write_buffer_4x4(in, coeff);
      break;
    case ADST_DCT:
      load_buffer_4x4(input, in, input_stride, 0, 0, shift[0]);
      fadst4x4_sse4_1(in, in, av1_fwd_cos_bit_col[txw_idx][txh_idx], 1);
      transpose_32bit_4x4(in, in);
      fdct4x4_sse4_1(in, in, av1_fwd_cos_bit_row[txw_idx][txh_idx], 1);
      write_buffer_4x4(in, coeff);
      break;
    case DCT_ADST:
      load_buffer_4x4(input, in, input_stride, 0, 0, shift[0]);
      fdct4x4_sse4_1(in, in, av1_fwd_cos_bit_col[txw_idx][txh_idx], 1);
      transpose_32bit_4x4(in, in);
      fadst4x4_sse4_1(in, in, av1_fwd_cos_bit_row[txw_idx][txh_idx], 1);
      write_buffer_4x4(in, coeff);
      break;
    case ADST_ADST:
      load_buffer_4x4(input, in, input_stride, 0, 0, shift[0]);
      fadst4x4_sse4_1(in, in, av1_fwd_cos_bit_col[txw_idx][txh_idx], 1);
      transpose_32bit_4x4(in, in);
      fadst4x4_sse4_1(in, in, av1_fwd_cos_bit_row[txw_idx][txh_idx], 1);
      write_buffer_4x4(in, coeff);
      break;
    case FLIPADST_DCT:
      load_buffer_4x4(input, in, input_stride, 1, 0, shift[0]);
      fadst4x4_sse4_1(in, in, av1_fwd_cos_bit_col[txw_idx][txh_idx], 1);
      transpose_32bit_4x4(in, in);
      fdct4x4_sse4_1(in, in, av1_fwd_cos_bit_row[txw_idx][txh_idx], 1);
      write_buffer_4x4(in, coeff);
      break;
    case DCT_FLIPADST:
      load_buffer_4x4(input, in, input_stride, 0, 1, shift[0]);
      fdct4x4_sse4_1(in, in, av1_fwd_cos_bit_col[txw_idx][txh_idx], 1);
      transpose_32bit_4x4(in, in);
      fadst4x4_sse4_1(in, in, av1_fwd_cos_bit_row[txw_idx][txh_idx], 1);
      write_buffer_4x4(in, coeff);
      break;
    case FLIPADST_FLIPADST:
      load_buffer_4x4(input, in, input_stride, 1, 1, shift[0]);
      fadst4x4_sse4_1(in, in, av1_fwd_cos_bit_col[txw_idx][txh_idx], 1);
      transpose_32bit_4x4(in, in);
      fadst4x4_sse4_1(in, in, av1_fwd_cos_bit_row[txw_idx][txh_idx], 1);
      write_buffer_4x4(in, coeff);
      break;
    case ADST_FLIPADST:
      load_buffer_4x4(input, in, input_stride, 0, 1, shift[0]);
      fadst4x4_sse4_1(in, in, av1_fwd_cos_bit_col[txw_idx][txh_idx], 1);
      transpose_32bit_4x4(in, in);
      fadst4x4_sse4_1(in, in, av1_fwd_cos_bit_row[txw_idx][txh_idx], 1);
      write_buffer_4x4(in, coeff);
      break;
    case FLIPADST_ADST:
      load_buffer_4x4(input, in, input_stride, 1, 0, shift[0]);
      fadst4x4_sse4_1(in, in, av1_fwd_cos_bit_col[txw_idx][txh_idx], 1);
      transpose_32bit_4x4(in, in);
      fadst4x4_sse4_1(in, in, av1_fwd_cos_bit_row[txw_idx][txh_idx], 1);
      write_buffer_4x4(in, coeff);
      break;
    case IDTX:
      load_buffer_4x4(input, in, input_stride, 0, 0, shift[0]);
      idtx4x4_sse4_1(in, in, av1_fwd_cos_bit_col[txw_idx][txh_idx], 1);
      transpose_32bit_4x4(in, in);
      idtx4x4_sse4_1(in, in, av1_fwd_cos_bit_row[txw_idx][txh_idx], 1);
      write_buffer_4x4(in, coeff);
      break;
    case V_DCT:
      load_buffer_4x4(input, in, input_stride, 0, 0, shift[0]);
      fdct4x4_sse4_1(in, in, av1_fwd_cos_bit_col[txw_idx][txh_idx], 1);
      transpose_32bit_4x4(in, in);
      idtx4x4_sse4_1(in, in, av1_fwd_cos_bit_row[txw_idx][txh_idx], 1);
      write_buffer_4x4(in, coeff);
      break;
    case H_DCT:
      load_buffer_4x4(input, in, input_stride, 0, 0, shift[0]);
      idtx4x4_sse4_1(in, in, av1_fwd_cos_bit_row[txw_idx][txh_idx], 1);
      transpose_32bit_4x4(in, in);
      fdct4x4_sse4_1(in, in, av1_fwd_cos_bit_col[txw_idx][txh_idx], 1);
      write_buffer_4x4(in, coeff);
      break;
    case V_ADST:
      load_buffer_4x4(input, in, input_stride, 0, 0, shift[0]);
      fadst4x4_sse4_1(in, in, av1_fwd_cos_bit_col[txw_idx][txh_idx], 1);
      transpose_32bit_4x4(in, in);
      idtx4x4_sse4_1(in, in, av1_fwd_cos_bit_row[txw_idx][txh_idx], 1);
      write_buffer_4x4(in, coeff);
      break;
    case H_ADST:
      load_buffer_4x4(input, in, input_stride, 0, 0, shift[0]);
      idtx4x4_sse4_1(in, in, av1_fwd_cos_bit_row[txw_idx][txh_idx], 1);
      transpose_32bit_4x4(in, in);
      fadst4x4_sse4_1(in, in, av1_fwd_cos_bit_col[txw_idx][txh_idx], 1);
      write_buffer_4x4(in, coeff);
      break;
    case V_FLIPADST:
      load_buffer_4x4(input, in, input_stride, 1, 0, shift[0]);
      fadst4x4_sse4_1(in, in, av1_fwd_cos_bit_row[txw_idx][txh_idx], 1);
      transpose_32bit_4x4(in, in);
      idtx4x4_sse4_1(in, in, av1_fwd_cos_bit_row[txw_idx][txh_idx], 1);
      write_buffer_4x4(in, coeff);
      break;
    case H_FLIPADST:
      load_buffer_4x4(input, in, input_stride, 0, 1, shift[0]);
      idtx4x4_sse4_1(in, in, av1_fwd_cos_bit_row[txw_idx][txh_idx], 1);
      transpose_32bit_4x4(in, in);
      fadst4x4_sse4_1(in, in, av1_fwd_cos_bit_row[txw_idx][txh_idx], 1);
      write_buffer_4x4(in, coeff);
      break;
    default: assert(0);
  }
  (void)bd;
}